

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiContext *pIVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *candidate_window;
  int i;
  int display_layer_delta;
  ImGuiContext *g;
  int local_28;
  bool local_1;
  
  pIVar1 = GImGui;
  iVar2 = GetWindowDisplayLayer(in_RDI);
  iVar3 = GetWindowDisplayLayer(in_RSI);
  if (iVar2 == iVar3) {
    local_28 = (pIVar1->Windows).Size;
    do {
      local_28 = local_28 + -1;
      if (local_28 < 0) {
        return false;
      }
      ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_28);
      if (*ppIVar4 == in_RDI) {
        return true;
      }
    } while (*ppIVar4 != in_RSI);
    local_1 = false;
  }
  else {
    local_1 = 0 < iVar2 - iVar3;
  }
  return local_1;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;

    // It would be saner to ensure that display layer is always reflected in the g.Windows[] order, which would likely requires altering all manipulations of that array
    const int display_layer_delta = GetWindowDisplayLayer(potential_above) - GetWindowDisplayLayer(potential_below);
    if (display_layer_delta != 0)
        return display_layer_delta > 0;

    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}